

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O1

void S_SetSoundPaused(int state)

{
  _func_int **pp_Var1;
  ulong uVar2;
  
  if (state == 0) {
    if (paused != 0) goto LAB_002fca5c;
    if ((mus_playing.handle != (MusInfo *)0x0) && (MusicPaused == '\0')) {
      (*(mus_playing.handle)->_vptr_MusInfo[5])();
      MusicPaused = '\x01';
    }
    if (GSnd == (SoundRenderer *)0x0) goto LAB_002fca5c;
    uVar2 = (ulong)(2 - (gamestate == GS_TITLELEVEL || gamestate == GS_LEVEL));
    pp_Var1 = GSnd->_vptr_SoundRenderer;
  }
  else {
    if (paused != 0) goto LAB_002fca5c;
    if ((mus_playing.handle != (MusInfo *)0x0) && (MusicPaused == '\x01')) {
      (*(mus_playing.handle)->_vptr_MusInfo[6])();
      MusicPaused = '\0';
    }
    if (GSnd == (SoundRenderer *)0x0) goto LAB_002fca5c;
    pp_Var1 = GSnd->_vptr_SoundRenderer;
    uVar2 = 0;
  }
  (*pp_Var1[0x17])(GSnd,uVar2);
LAB_002fca5c:
  if ((netgame == false) && (demoplayback == false)) {
    pauseext = state == 0;
  }
  return;
}

Assistant:

void S_SetSoundPaused (int state)
{
	if (state)
	{
		if (paused == 0)
		{
			S_ResumeSound(true);
			if (GSnd != NULL)
			{
				GSnd->SetInactive(SoundRenderer::INACTIVE_Active);
			}
		}
	}
	else
	{
		if (paused == 0)
		{
			S_PauseSound(false, true);
			if (GSnd !=  NULL)
			{
				GSnd->SetInactive(gamestate == GS_LEVEL || gamestate == GS_TITLELEVEL ?
					SoundRenderer::INACTIVE_Complete :
					SoundRenderer::INACTIVE_Mute);
			}
		}
	}
	if (!netgame
#ifdef _DEBUG
		&& !demoplayback
#endif
		)
	{
		pauseext = !state;
	}
}